

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stream.hpp
# Opt level: O2

void __thiscall Centaurus::StreamException::StreamException(StreamException *this,string *msg)

{
  *(undefined ***)this = &PTR__StreamException_00196db0;
  std::__cxx11::string::string((string *)&this->m_msg,(string *)msg);
  return;
}

Assistant:

StreamException(const std::string& msg) noexcept
        : m_msg(msg)
    {
    }